

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::anon_unknown_1::DrawTestShaderProgram::shadeVertices
          (DrawTestShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  GenericVecType GVar2;
  VertexPacket *pVVar3;
  const_reference cVar4;
  UniformSlot *pUVar5;
  VertexAttrib *vertexAttrib;
  int attribNdx;
  size_type __n;
  float fVar6;
  float fVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar10;
  float fVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar15;
  ulong uVar16;
  undefined1 in_XMM2 [16];
  double dVar18;
  undefined1 auVar17 [16];
  float local_f8 [2];
  float local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  Vector<float,_2> local_d0;
  float local_c8;
  Vector<float,_2> local_c0;
  undefined1 local_b8 [24];
  VertexAttrib *local_a0;
  VertexPacket **local_98;
  ulong local_90;
  ulong local_88;
  vector<bool,_std::allocator<bool>_> *local_80;
  Vector<float,_4> local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  
  local_a0 = inputs;
  local_98 = packets;
  pUVar5 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_coordScale");
  local_b8._0_16_ = *(undefined1 (*) [16])&pUVar5->value;
  pUVar5 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_colorScale");
  local_68 = (pUVar5->value).f;
  local_58 = ZEXT416((uint)local_68);
  local_80 = &this->m_isCoord;
  local_88 = 0;
  local_90 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_90 = local_88;
  }
  local_b8._4_4_ = local_b8._0_4_;
  local_b8._8_4_ = local_b8._0_4_;
  local_b8._12_4_ = local_b8._0_4_;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  do {
    if (local_88 == local_90) {
      return;
    }
    pVVar3 = local_98[local_88];
    local_c0.m_data[0] = 0.0;
    local_c0.m_data[1] = 0.0;
    local_f8[0] = 1.0;
    local_f8[1] = 1.0;
    local_f0 = 1.0;
    vertexAttrib = local_a0;
    for (__n = 0; (long)__n <
                  (long)(int)((ulong)((long)(this->m_attrType).
                                            super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_attrType).
                                           super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2);
        __n = __n + 1) {
      iVar1 = (this->m_componentCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[__n];
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](local_80,__n);
      GVar2 = (this->m_attrType).
              super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>._M_impl.
              super__Vector_impl_data._M_start[__n];
      if (GVar2 == GENERICVECTYPE_INT32) {
        rr::readVertexAttribInt((rr *)&local_e8,vertexAttrib,pVVar3->instanceNdx,pVVar3->vertexNdx);
        if (cVar4) {
          switch(iVar1 + -1) {
          case 0:
            local_d0.m_data[1] = (float)(int)local_e8;
LAB_0150117b:
            local_d0.m_data[0] = local_d0.m_data[1];
            break;
          case 1:
            local_d0.m_data[0] = (float)(int)local_e8;
            local_d0.m_data[1] = (float)(int)fStack_e4;
            break;
          case 2:
            fVar6 = (float)(int)local_e8;
            fVar9 = (float)(int)fStack_e0;
            in_XMM2._0_4_ = (float)(int)fStack_e4;
LAB_015012ba:
            local_d0.m_data[1] = in_XMM2._0_4_;
            local_d0.m_data[0] = fVar9 + fVar6;
            break;
          case 3:
            fVar6 = (float)(int)local_e8;
            fVar9 = (float)(int)fStack_e4;
            fVar10 = (float)(int)fStack_e0;
            fVar14 = (float)(int)fStack_dc;
LAB_01501431:
            local_d0.m_data[0] = fVar10 + fVar6;
            local_d0.m_data[1] = fVar14 + fVar9;
            break;
          default:
            goto switchD_015010f6_default;
          }
LAB_015014a0:
          tcu::Vector<float,_2>::operator+=(&local_c0,&local_d0);
        }
        else {
          switch(iVar1 + -1) {
          case 0:
            fVar6 = (float)(int)local_e8;
LAB_015011f3:
            tcu::operator*((tcu *)&local_d0,fVar6,(Vector<float,_3> *)local_f8);
            local_f0 = local_c8;
            local_f8[0] = local_d0.m_data[0];
            local_f8[1] = local_d0.m_data[1];
            break;
          case 1:
            fVar6 = (float)(int)local_e8;
            fVar9 = (float)(int)fStack_e4;
LAB_015014c6:
            local_f8[0] = fVar6 * local_f8[0];
            local_f8[1] = fVar9 * local_f8[1];
            break;
          case 2:
            local_f8[0] = (float)(int)local_e8 * local_f8[0];
            local_f8[1] = (float)(int)fStack_e4 * local_f8[1];
            fVar6 = (float)(int)fStack_e0;
LAB_01501333:
            local_f0 = fVar6 * local_f0;
            break;
          case 3:
            fVar6 = (float)(int)fStack_dc;
            uVar16 = CONCAT44((float)(int)fStack_e4 * local_f8[1],(float)(int)local_e8 * local_f8[0]
                             );
            local_f8[0] = fVar6 * (float)(int)local_e8 * local_f8[0];
            local_f8[1] = fVar6 * (float)(int)fStack_e4 * local_f8[1];
            fVar9 = (float)(int)fStack_e0;
LAB_0150141d:
            local_f0 = fVar9 * local_f0;
LAB_01501488:
            in_XMM2._8_8_ = 0;
            in_XMM2._0_8_ = uVar16;
            local_f0 = local_f0 * fVar6;
          }
        }
      }
      else if (GVar2 == GENERICVECTYPE_UINT32) {
        rr::readVertexAttribUint((rr *)&local_e8,vertexAttrib,pVVar3->instanceNdx,pVVar3->vertexNdx)
        ;
        dVar15 = (double)DAT_016ff520;
        dVar18 = DAT_016ff520._8_8_;
        if (cVar4) {
          switch(iVar1 + -1) {
          case 0:
            local_d0.m_data[1] = (float)(uint)local_e8;
            goto LAB_0150117b;
          case 1:
            auVar8._4_4_ = 0;
            auVar8._0_4_ = local_e8;
            auVar8._8_4_ = fStack_e4;
            auVar8._12_4_ = 0;
            local_d0.m_data[0] = (float)(SUB168(auVar8 | _DAT_016ff520,0) - dVar15);
            local_d0.m_data[1] = (float)(SUB168(auVar8 | _DAT_016ff520,8) - dVar18);
            goto LAB_015014a0;
          case 2:
            fVar6 = (float)(uint)local_e8;
            fVar9 = (float)(uint)fStack_e0;
            in_XMM2._0_4_ = (float)(uint)fStack_e4;
            goto LAB_015012ba;
          case 3:
            in_XMM2 = ZEXT816(0);
            auVar7._4_4_ = 0;
            auVar7._0_4_ = local_e8;
            auVar7._8_4_ = fStack_e4;
            auVar7._12_4_ = 0;
            fVar6 = (float)(SUB168(auVar7 | _DAT_016ff520,0) - dVar15);
            fVar9 = (float)(SUB168(auVar7 | _DAT_016ff520,8) - dVar18);
            auVar12._4_4_ = 0;
            auVar12._0_4_ = fStack_e0;
            auVar12._8_4_ = fStack_dc;
            auVar12._12_4_ = 0;
            fVar10 = (float)(SUB168(auVar12 | _DAT_016ff520,0) - dVar15);
            fVar14 = (float)(SUB168(auVar12 | _DAT_016ff520,8) - dVar18);
            goto LAB_01501431;
          }
        }
        else {
          switch(iVar1 + -1) {
          case 0:
            fVar6 = (float)(uint)local_e8;
            goto LAB_015011f3;
          case 1:
            auVar13._4_4_ = 0;
            auVar13._0_4_ = local_e8;
            auVar13._8_4_ = fStack_e4;
            auVar13._12_4_ = 0;
            fVar6 = (float)(SUB168(auVar13 | _DAT_016ff520,0) - dVar15);
            fVar9 = (float)(SUB168(auVar13 | _DAT_016ff520,8) - dVar18);
            in_XMM2 = _DAT_016ff520;
            goto LAB_015014c6;
          case 2:
            auVar11._4_4_ = 0;
            auVar11._0_4_ = local_e8;
            auVar11._8_4_ = fStack_e4;
            auVar11._12_4_ = 0;
            local_f8[0] = (float)(SUB168(auVar11 | _DAT_016ff520,0) - dVar15) * local_f8[0];
            local_f8[1] = (float)(SUB168(auVar11 | _DAT_016ff520,8) - dVar18) * local_f8[1];
            fVar6 = (float)(uint)fStack_e0;
            in_XMM2 = _DAT_016ff520;
            goto LAB_01501333;
          case 3:
            fVar6 = (float)(uint)fStack_dc;
            auVar17._4_4_ = 0;
            auVar17._0_4_ = local_e8;
            auVar17._8_4_ = fStack_e4;
            auVar17._12_4_ = 0;
            local_f8[0] = (float)(SUB168(auVar17 | _DAT_016ff520,0) - dVar15) * local_f8[0];
            local_f8[1] = (float)(SUB168(auVar17 | _DAT_016ff520,8) - dVar18) * local_f8[1];
            uVar16 = CONCAT44(local_f8[1],local_f8[0]);
            local_f8[0] = fVar6 * local_f8[0];
            local_f8[1] = fVar6 * local_f8[1];
            fVar9 = (float)(uint)fStack_e0;
            goto LAB_0150141d;
          }
        }
      }
      else if (GVar2 == GENERICVECTYPE_FLOAT) {
        rr::readVertexAttribFloat
                  ((rr *)&local_e8,vertexAttrib,pVVar3->instanceNdx,pVVar3->vertexNdx);
        if (cVar4) {
          switch(iVar1 + -1) {
          case 0:
            local_d0.m_data[1] = local_e8;
            goto LAB_0150117b;
          case 1:
            local_d0.m_data[1] = fStack_e4;
            local_d0.m_data[0] = local_e8;
            break;
          case 2:
            local_d0.m_data[1] = fStack_e4;
            local_d0.m_data[0] = local_e8 + fStack_e0;
            break;
          case 3:
            fVar6 = local_e8;
            fVar9 = fStack_e4;
            fVar10 = fStack_e0;
            fVar14 = fStack_dc;
            goto LAB_01501431;
          default:
            goto switchD_015010f6_default;
          }
          goto LAB_015014a0;
        }
        switch(iVar1 + -1) {
        case 0:
          fVar6 = local_e8;
          goto LAB_015011f3;
        case 1:
          fVar6 = local_e8;
          fVar9 = fStack_e4;
          goto LAB_015014c6;
        case 2:
          local_f8[0] = local_e8 * local_f8[0];
          local_f8[1] = fStack_e4 * local_f8[1];
          local_f0 = local_f0 * fStack_e0;
          break;
        case 3:
          uVar16 = CONCAT44(fStack_e4 * local_f8[1],local_e8 * local_f8[0]);
          local_f8[0] = fStack_dc * local_e8 * local_f8[0];
          local_f8[1] = fStack_dc * fStack_e4 * local_f8[1];
          local_f0 = local_f0 * fStack_e0;
          fVar6 = fStack_dc;
          goto LAB_01501488;
        }
      }
switchD_015010f6_default:
      vertexAttrib = vertexAttrib + 1;
    }
    *(ulong *)(pVVar3->position).m_data =
         CONCAT44(local_c0.m_data[1] * (float)local_b8._4_4_,
                  local_c0.m_data[0] * (float)local_b8._0_4_);
    (pVVar3->position).m_data[2] = 1.0;
    (pVVar3->position).m_data[3] = 1.0;
    pVVar3->pointSize = 1.0;
    local_78.m_data[2] = local_f0 * (float)local_58._0_4_;
    local_78.m_data[0] = local_f8[0] * local_68;
    local_78.m_data[1] = local_f8[1] * fStack_64;
    local_78.m_data[3] = 1.0;
    tcu::operator*((tcu *)&local_d0,0.5,&local_78);
    local_48 = &DAT_3f0000003f000000;
    puStack_40 = &DAT_3f0000003f000000;
    tcu::operator+((tcu *)&local_e8,(Vector<float,_4> *)&local_d0,(Vector<float,_4> *)&local_48);
    *(ulong *)&pVVar3->outputs[0].v = CONCAT44(fStack_e4,local_e8);
    *(ulong *)((long)&pVVar3->outputs[0].v + 8) = CONCAT44(fStack_dc,fStack_e0);
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void DrawTestShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	const float	u_coordScale = getUniformByName("u_coordScale").value.f;
	const float u_colorScale = getUniformByName("u_colorScale").value.f;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const size_t varyingLocColor = 0;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Calc output color
		tcu::Vec2 coord = tcu::Vec2(0.0, 0.0);
		tcu::Vec3 color = tcu::Vec3(1.0, 1.0, 1.0);

		for (int attribNdx = 0; attribNdx < (int)m_attrType.size(); attribNdx++)
		{
			const int	numComponents	= m_componentCount[attribNdx];
			const bool	isCoord			= m_isCoord[attribNdx];

			switch (m_attrType[attribNdx])
			{
				case rr::GENERICVECTYPE_FLOAT:	calcShaderColorCoord(coord, color, rr::readVertexAttribFloat(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_INT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribInt	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_UINT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribUint	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				default:
					DE_ASSERT(false);
			}
		}

		// Transform position
		{
			packet.position = tcu::Vec4(u_coordScale * coord.x(), u_coordScale * coord.y(), 1.0f, 1.0f);
			packet.pointSize = 1.0f;
		}

		// Pass color to FS
		{
			packet.outputs[varyingLocColor] = tcu::Vec4(u_colorScale * color.x(), u_colorScale * color.y(), u_colorScale * color.z(), 1.0f) * 0.5f + tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
		}
	}
}